

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_huffman_codes.cpp
# Opt level: O3

bool lzham::generate_huffman_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret,code_size_histogram *code_size_hist)

{
  int iVar1;
  int *piVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint *puVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  int x [1024];
  uint auStack_1438 [254];
  uint auStack_1040 [258];
  uint local_c38 [770];
  
  if (0x3ff < num_syms - 1) goto LAB_00104ddc;
  uVar15 = 0;
  uVar9 = 0;
  uVar19 = 0;
  do {
    uVar3 = pFreq[uVar15];
    if (uVar3 == 0) {
      pCodesizes[uVar15] = '\0';
    }
    else {
      uVar9 = uVar9 + uVar3;
      *(short *)((long)pContext + uVar19 * 8 + 4) = (short)uVar15;
      *(undefined2 *)((long)pContext + uVar19 * 8 + 6) = 0xffff;
      *(uint *)((long)pContext + uVar19 * 8) = (uint)uVar3;
      uVar19 = (ulong)((int)uVar19 + 1);
    }
    uVar15 = uVar15 + 1;
  } while (num_syms != uVar15);
  *total_freq_ret = uVar9;
  uVar18 = (uint)uVar19;
  if (uVar18 == 1) {
    pCodesizes[*(ushort *)((long)pContext + 4)] = '\x01';
    goto LAB_00104ddc;
  }
  memset(auStack_1040 + 2,0,0x800);
  bVar20 = true;
  bVar5 = true;
  uVar15 = (ulong)(uVar18 & 0xfffffffe);
  if ((uVar19 & 0xfffffffe) != 0) {
    puVar16 = (uint *)((long)pContext + uVar15 * 8);
    puVar12 = (uint *)pContext;
    do {
      uVar7 = *puVar12;
      uVar11 = puVar12[2];
      auStack_1040[(ulong)(uVar7 & 0xff) + 2] = auStack_1040[(ulong)(uVar7 & 0xff) + 2] + 1;
      piVar2 = (int *)((long)local_c38 + (ulong)(uVar7 >> 6 & 0x3fc));
      *piVar2 = *piVar2 + 1;
      auStack_1040[(ulong)(uVar11 & 0xff) + 2] = auStack_1040[(ulong)(uVar11 & 0xff) + 2] + 1;
      piVar2 = (int *)((long)local_c38 + (ulong)(uVar11 >> 6 & 0x3fc));
      *piVar2 = *piVar2 + 1;
      puVar12 = puVar12 + 4;
    } while (puVar12 != puVar16);
    bVar5 = true;
    if ((uVar19 & 1) != 0) {
      uVar7 = *puVar16;
      auStack_1040[(ulong)(uVar7 & 0xff) + 2] = auStack_1040[(ulong)(uVar7 & 0xff) + 2] + 1;
      piVar2 = (int *)((long)local_c38 + (ulong)(uVar7 >> 6 & 0x3fc));
      *piVar2 = *piVar2 + 1;
      bVar5 = false;
    }
  }
  lVar6 = 0;
  puVar16 = (uint *)((long)pContext + 0x4008);
  do {
    puVar12 = puVar16;
    uVar13 = 0xfffffffffffffffe;
    uVar7 = 0;
    do {
      auStack_1438[uVar13 + 2] = uVar7;
      uVar11 = auStack_1040[lVar6 * 0x100 + uVar13 + 4];
      auStack_1438[uVar13 + 3] = uVar7 + uVar11;
      uVar7 = uVar7 + uVar11 + auStack_1040[lVar6 * 0x100 + uVar13 + 5];
      uVar13 = uVar13 + 2;
    } while (uVar13 < 0xfe);
    puVar16 = (uint *)pContext;
    if (uVar15 != 0) {
      puVar16 = (uint *)((long)pContext + uVar15 * 2 * 4);
      lVar17 = 0;
      do {
        uVar7 = *(uint *)((long)pContext + lVar17 + 8);
        uVar11 = uVar7 >> 8;
        uVar8 = *(uint *)((long)pContext + lVar17) >> 8;
        if (bVar20) {
          uVar11 = uVar7;
          uVar8 = *(uint *)((long)pContext + lVar17);
        }
        uVar8 = uVar8 & 0xff;
        uVar11 = uVar11 & 0xff;
        uVar7 = auStack_1438[uVar8];
        if (uVar8 == uVar11) {
          auStack_1438[uVar8] = uVar7 + 2;
          *(undefined8 *)(puVar12 + (ulong)uVar7 * 2) = *(undefined8 *)((long)pContext + lVar17);
          uVar8 = uVar7 + 1;
        }
        else {
          auStack_1438[uVar8] = uVar7 + 1;
          uVar8 = auStack_1438[uVar11];
          auStack_1438[uVar11] = uVar8 + 1;
          *(undefined8 *)(puVar12 + (ulong)uVar7 * 2) = *(undefined8 *)((long)pContext + lVar17);
        }
        *(undefined8 *)(puVar12 + (ulong)uVar8 * 2) = *(undefined8 *)((long)pContext + lVar17 + 8);
        lVar17 = lVar17 + 0x10;
      } while ((ulong)(uVar18 & 0xfffffffe) << 3 != lVar17);
    }
    if (!bVar5) {
      uVar11 = *puVar16 >> (sbyte)((int)lVar6 << 3) & 0xff;
      uVar7 = auStack_1438[uVar11];
      auStack_1438[uVar11] = uVar7 + 1;
      *(undefined8 *)(puVar12 + (ulong)uVar7 * 2) = *(undefined8 *)puVar16;
    }
    lVar6 = 1;
    uVar7 = 0;
    bVar4 = (bool)(local_c38[0] != uVar18 & bVar20);
    bVar20 = false;
    puVar16 = (uint *)pContext;
    pContext = puVar12;
  } while (bVar4);
  if (uVar18 != 0) {
    uVar15 = 0;
    do {
      auStack_1040[uVar15 + 2] = puVar12[uVar15 * 2];
      uVar15 = uVar15 + 1;
    } while (uVar19 != uVar15);
    if (uVar18 != 0) {
      auStack_1040[2] = auStack_1040[2] + auStack_1040[3];
      uVar7 = uVar18 - 1;
      if ((int)uVar18 < 3) {
        auStack_1040[(int)uVar18] = 0;
      }
      else {
        iVar14 = 0;
        iVar10 = 2;
        uVar15 = 1;
        do {
          lVar6 = (long)iVar14;
          if ((iVar10 < (int)uVar18) &&
             (lVar17 = (long)iVar10, (int)auStack_1040[lVar17 + 2] <= (int)auStack_1040[lVar6 + 2]))
          {
            iVar10 = iVar10 + 1;
            auStack_1040[uVar15 + 2] = auStack_1040[lVar17 + 2];
          }
          else {
            auStack_1040[uVar15 + 2] = auStack_1040[lVar6 + 2];
            iVar14 = iVar14 + 1;
            auStack_1040[lVar6 + 2] = (uint)uVar15;
            lVar6 = (long)iVar14;
          }
          if (iVar10 < (int)uVar18) {
            if (lVar6 < (long)uVar15) {
              uVar11 = auStack_1040[lVar6 + 2];
              uVar8 = auStack_1040[(long)iVar10 + 2];
              if ((int)uVar11 < (int)uVar8) goto LAB_00104ca8;
            }
            else {
              uVar8 = auStack_1040[(long)iVar10 + 2];
            }
            iVar10 = iVar10 + 1;
            auStack_1040[uVar15 + 2] = auStack_1040[uVar15 + 2] + uVar8;
          }
          else {
            uVar11 = auStack_1040[lVar6 + 2];
LAB_00104ca8:
            auStack_1040[uVar15 + 2] = auStack_1040[uVar15 + 2] + uVar11;
            iVar14 = iVar14 + 1;
            auStack_1040[lVar6 + 2] = (uint)uVar15;
          }
          uVar15 = uVar15 + 1;
        } while (uVar7 != uVar15);
        auStack_1040[(int)uVar18] = 0;
        uVar15 = (ulong)(uVar18 - 3);
        do {
          auStack_1040[uVar15 + 2] = auStack_1040[(long)(int)auStack_1040[uVar15 + 2] + 2] + 1;
          bVar20 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar20);
      }
      uVar11 = uVar18 - 2;
      iVar10 = 1;
      uVar8 = 0;
      do {
        if ((int)uVar11 < 0) {
          iVar14 = 0;
        }
        else {
          iVar1 = uVar11 + 1;
          iVar14 = 0;
          do {
            if (auStack_1040[(ulong)uVar11 + 2] != uVar8) goto LAB_00104d69;
            iVar14 = iVar14 + 1;
            uVar11 = uVar11 - 1;
          } while (iVar1 != iVar14);
          uVar11 = 0xffffffff;
          iVar14 = iVar1;
        }
LAB_00104d69:
        if (iVar14 < iVar10) {
          puVar16 = auStack_1040 + (long)(int)uVar7 + 2;
          uVar7 = (uVar7 + iVar14) - iVar10;
          do {
            *puVar16 = uVar8;
            iVar10 = iVar10 + -1;
            puVar16 = puVar16 + -1;
          } while (iVar14 < iVar10);
        }
        iVar10 = iVar14 * 2;
        uVar8 = uVar8 + 1;
      } while (iVar14 != 0);
      if (uVar18 != 0) {
        uVar15 = 0;
        uVar7 = 0;
        do {
          uVar18 = auStack_1040[uVar15 + 2];
          if (uVar7 < uVar18) {
            uVar7 = uVar18;
          }
          uVar13 = 0x20;
          if (uVar18 < 0x20) {
            uVar13 = (ulong)uVar18;
          }
          code_size_hist->m_num_codes[uVar13] = code_size_hist->m_num_codes[uVar13] + 1;
          pCodesizes[(ushort)puVar12[uVar15 * 2 + 1]] = (uint8)uVar18;
          uVar15 = uVar15 + 1;
        } while (uVar19 != uVar15);
        goto LAB_00104dd9;
      }
    }
    uVar7 = 0;
  }
LAB_00104dd9:
  *max_code_size = uVar7;
LAB_00104ddc:
  return num_syms - 1 < 0x400;
}

Assistant:

bool generate_huffman_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret, code_size_histogram &code_size_hist)
   {
      if ((!num_syms) || (num_syms > cHuffmanMaxSupportedSyms))
         return false;
                  
      huffman_work_tables& state = *static_cast<huffman_work_tables*>(pContext);;
            
      uint max_freq = 0;
      uint total_freq = 0;
      
      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];
         
         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);
            
            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_left = (uint16)i;
            sf.m_right = cUINT16_MAX;
            sf.m_freq = freq;
            num_used_syms++;
         }            
      }
      
      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_left] = 1;
         return true;
      }

      sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
      
      int x[cHuffmanMaxSupportedSyms];
      for (uint i = 0; i < num_used_syms; i++)
         x[i] = syms[i].m_freq;
      
      calculate_minimum_redundancy(x, num_used_syms);
      
      uint max_len = 0;
      for (uint i = 0; i < num_used_syms; i++)
      {
         uint len = x[i];
         max_len = math::maximum(len, max_len);
         code_size_hist.m_num_codes[LZHAM_MIN(len, (uint)code_size_histogram::cMaxUnlimitedHuffCodeSize)]++;
         pCodesizes[syms[i].m_left] = static_cast<uint8>(len);
      }
      max_code_size = max_len;
                  
      return true;
   }